

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStateDirectory.cxx
# Opt level: O0

char * __thiscall cmStateDirectory::GetProperty(cmStateDirectory *this,string *prop,bool chain)

{
  PositionType *this_00;
  pointer *__return_storage_ptr__;
  bool bVar1;
  __type _Var2;
  int iVar3;
  vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> *this_01;
  size_type __n;
  string *psVar4;
  PointerType pBVar5;
  cmStateDirectory local_388;
  undefined1 local_360 [8];
  cmStateSnapshot parentSnapshot;
  char *retVal;
  string local_330;
  cmStringRange local_310;
  string local_300;
  cmStringRange local_2e0;
  string local_2d0;
  cmStringRange local_2b0;
  string local_2a0;
  cmStringRange local_280;
  string local_270;
  string local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_230;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_228;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_220;
  undefined1 local_208 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  res;
  string local_1d8;
  string local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_198;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_190;
  cmStateSnapshot local_188;
  string local_170;
  undefined1 local_150 [8];
  cmStateSnapshot snp;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  listFiles;
  string local_100;
  cmStateDirectory local_e0;
  reference local_b8;
  cmStateSnapshot *ci;
  const_iterator __end2;
  const_iterator __begin2;
  vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> *__range2;
  vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> *children;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  child_dirs;
  undefined1 local_40 [8];
  cmStateSnapshot parent;
  bool chain_local;
  string *prop_local;
  cmStateDirectory *this_local;
  
  parent.Position.Position._7_1_ = chain;
  if ((GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_)
     , iVar3 != 0)) {
    std::__cxx11::string::string
              ((string *)&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_);
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_);
  }
  std::__cxx11::string::clear();
  bVar1 = std::operator==(prop,"PARENT_DIRECTORY");
  if (bVar1) {
    cmStateSnapshot::GetBuildsystemDirectoryParent((cmStateSnapshot *)local_40,&this->Snapshot_);
    bVar1 = cmStateSnapshot::IsValid((cmStateSnapshot *)local_40);
    if (bVar1) {
      cmStateSnapshot::GetDirectory
                ((cmStateDirectory *)
                 &child_dirs.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(cmStateSnapshot *)local_40);
      GetCurrentSource_abi_cxx11_
                ((cmStateDirectory *)
                 &child_dirs.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      this_local = (cmStateDirectory *)std::__cxx11::string::c_str();
    }
    else {
      this_local = (cmStateDirectory *)0x8e0830;
    }
  }
  else {
    _Var2 = std::operator==(prop,&kBINARY_DIR_abi_cxx11_);
    if (_Var2) {
      psVar4 = GetCurrentBinary_abi_cxx11_(this);
      std::__cxx11::string::operator=
                ((string *)&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_,
                 (string *)psVar4);
      this_local = (cmStateDirectory *)std::__cxx11::string::c_str();
    }
    else {
      _Var2 = std::operator==(prop,&kSOURCE_DIR_abi_cxx11_);
      if (_Var2) {
        psVar4 = GetCurrentSource_abi_cxx11_(this);
        std::__cxx11::string::operator=
                  ((string *)&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_,
                   (string *)psVar4);
        this_local = (cmStateDirectory *)std::__cxx11::string::c_str();
      }
      else {
        _Var2 = std::operator==(prop,&kSUBDIRECTORIES_abi_cxx11_);
        if (_Var2) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&children);
          pBVar5 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                             (&this->DirectoryState);
          this_01 = &pBVar5->Children;
          __n = std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>::size(this_01);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&children,__n);
          __end2 = std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>::begin(this_01);
          ci = (cmStateSnapshot *)
               std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>::end(this_01);
          while (bVar1 = __gnu_cxx::operator!=
                                   (&__end2,(__normal_iterator<const_cmStateSnapshot_*,_std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>_>
                                             *)&ci), bVar1) {
            local_b8 = __gnu_cxx::
                       __normal_iterator<const_cmStateSnapshot_*,_std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>_>
                       ::operator*(&__end2);
            cmStateSnapshot::GetDirectory(&local_e0,local_b8);
            psVar4 = GetCurrentSource_abi_cxx11_(&local_e0);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&children,psVar4);
            __gnu_cxx::
            __normal_iterator<const_cmStateSnapshot_*,_std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>_>
            ::operator++(&__end2);
          }
          cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    (&local_100,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&children,";");
          std::__cxx11::string::operator=
                    ((string *)&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_,
                     (string *)&local_100);
          std::__cxx11::string::~string((string *)&local_100);
          this_local = (cmStateDirectory *)std::__cxx11::string::c_str();
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&children);
        }
        else {
          _Var2 = std::operator==(prop,&kBUILDSYSTEM_TARGETS_abi_cxx11_);
          if (_Var2) {
            pBVar5 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::
                     operator->(&this->DirectoryState);
            cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                      ((string *)
                       &listFiles.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       &pBVar5->NormalTargetNames,";");
            std::__cxx11::string::operator=
                      ((string *)&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_,
                       (string *)
                       &listFiles.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
            std::__cxx11::string::~string
                      ((string *)
                       &listFiles.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
            this_local = (cmStateDirectory *)std::__cxx11::string::c_str();
          }
          else {
            bVar1 = std::operator==(prop,"LISTFILE_STACK");
            if (bVar1) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&snp.Position.Position);
              local_150 = (undefined1  [8])(this->Snapshot_).State;
              snp.State = (cmState *)(this->Snapshot_).Position.Tree;
              snp.Position.Tree =
                   (cmLinkedTree<cmStateDetail::SnapshotDataType> *)
                   (this->Snapshot_).Position.Position;
              while (bVar1 = cmStateSnapshot::IsValid((cmStateSnapshot *)local_150), bVar1) {
                cmStateSnapshot::GetExecutionListFile_abi_cxx11_
                          (&local_170,(cmStateSnapshot *)local_150);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&snp.Position.Position,&local_170);
                std::__cxx11::string::~string((string *)&local_170);
                cmStateSnapshot::GetCallStackParent(&local_188,(cmStateSnapshot *)local_150);
                local_150 = (undefined1  [8])local_188.State;
                snp.State = (cmState *)local_188.Position.Tree;
                snp.Position.Tree =
                     (cmLinkedTree<cmStateDetail::SnapshotDataType> *)local_188.Position.Position;
              }
              this_00 = &snp.Position.Position;
              local_190._M_current =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)this_00);
              local_198 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)this_00);
              std::
              reverse<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                        (local_190,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          )local_198);
              cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                        (&local_1b8,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&snp.Position.Position,";");
              std::__cxx11::string::operator=
                        ((string *)&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_
                         ,(string *)&local_1b8);
              std::__cxx11::string::~string((string *)&local_1b8);
              this_local = (cmStateDirectory *)std::__cxx11::string::c_str();
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&snp.Position.Position);
            }
            else {
              bVar1 = std::operator==(prop,"CACHE_VARIABLES");
              if (bVar1) {
                __return_storage_ptr__ =
                     &res.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
                cmState::GetCacheEntryKeys_abi_cxx11_
                          ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)__return_storage_ptr__,(this->Snapshot_).State);
                cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                          (&local_1d8,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)__return_storage_ptr__,";");
                std::__cxx11::string::operator=
                          ((string *)
                           &GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_,
                           (string *)&local_1d8);
                std::__cxx11::string::~string((string *)&local_1d8);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&res.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
                this_local = (cmStateDirectory *)std::__cxx11::string::c_str();
              }
              else {
                bVar1 = std::operator==(prop,"VARIABLES");
                if (bVar1) {
                  cmStateSnapshot::ClosureKeys_abi_cxx11_
                            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_208,&this->Snapshot_);
                  cmState::GetCacheEntryKeys_abi_cxx11_(&local_220,(this->Snapshot_).State);
                  cmAppend<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_208,&local_220);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector(&local_220);
                  local_228._M_current =
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_208);
                  local_230 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              std::
                              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)local_208);
                  std::
                  sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                            (local_228,
                             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              )local_230);
                  cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                            (&local_250,
                             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_208,";");
                  std::__cxx11::string::operator=
                            ((string *)
                             &GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_,
                             (string *)&local_250);
                  std::__cxx11::string::~string((string *)&local_250);
                  this_local = (cmStateDirectory *)std::__cxx11::string::c_str();
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_208);
                }
                else {
                  bVar1 = std::operator==(prop,"INCLUDE_DIRECTORIES");
                  if (bVar1) {
                    local_280 = GetIncludeDirectoriesEntries_abi_cxx11_(this);
                    cmJoin<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                              (&local_270,&local_280,";");
                    std::__cxx11::string::operator=
                              ((string *)
                               &GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_,
                               (string *)&local_270);
                    std::__cxx11::string::~string((string *)&local_270);
                    this_local = (cmStateDirectory *)std::__cxx11::string::c_str();
                  }
                  else {
                    bVar1 = std::operator==(prop,"COMPILE_OPTIONS");
                    if (bVar1) {
                      local_2b0 = GetCompileOptionsEntries_abi_cxx11_(this);
                      cmJoin<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                                (&local_2a0,&local_2b0,";");
                      std::__cxx11::string::operator=
                                ((string *)
                                 &GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_,
                                 (string *)&local_2a0);
                      std::__cxx11::string::~string((string *)&local_2a0);
                      this_local = (cmStateDirectory *)std::__cxx11::string::c_str();
                    }
                    else {
                      bVar1 = std::operator==(prop,"COMPILE_DEFINITIONS");
                      if (bVar1) {
                        local_2e0 = GetCompileDefinitionsEntries_abi_cxx11_(this);
                        cmJoin<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                                  (&local_2d0,&local_2e0,";");
                        std::__cxx11::string::operator=
                                  ((string *)
                                   &GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_
                                   ,(string *)&local_2d0);
                        std::__cxx11::string::~string((string *)&local_2d0);
                        this_local = (cmStateDirectory *)std::__cxx11::string::c_str();
                      }
                      else {
                        bVar1 = std::operator==(prop,"LINK_OPTIONS");
                        if (bVar1) {
                          local_310 = GetLinkOptionsEntries_abi_cxx11_(this);
                          cmJoin<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                                    (&local_300,&local_310,";");
                          std::__cxx11::string::operator=
                                    ((string *)
                                     &GetProperty(std::__cxx11::string_const&,bool)::
                                      output_abi_cxx11_,(string *)&local_300);
                          std::__cxx11::string::~string((string *)&local_300);
                          this_local = (cmStateDirectory *)std::__cxx11::string::c_str();
                        }
                        else {
                          bVar1 = std::operator==(prop,"LINK_DIRECTORIES");
                          if (bVar1) {
                            _retVal = GetLinkDirectoriesEntries_abi_cxx11_(this);
                            cmJoin<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                                      (&local_330,
                                       (cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                        *)&retVal,";");
                            std::__cxx11::string::operator=
                                      ((string *)
                                       &GetProperty(std::__cxx11::string_const&,bool)::
                                        output_abi_cxx11_,(string *)&local_330);
                            std::__cxx11::string::~string((string *)&local_330);
                            this_local = (cmStateDirectory *)std::__cxx11::string::c_str();
                          }
                          else {
                            pBVar5 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::
                                     iterator::operator->(&this->DirectoryState);
                            parentSnapshot.Position.Position =
                                 (PositionType)
                                 cmPropertyMap::GetPropertyValue(&pBVar5->Properties,prop);
                            this_local = (cmStateDirectory *)parentSnapshot.Position.Position;
                            if (((cmStateDirectory *)parentSnapshot.Position.Position ==
                                 (cmStateDirectory *)0x0) &&
                               ((parent.Position.Position._7_1_ & 1) != 0)) {
                              cmStateSnapshot::GetBuildsystemDirectoryParent
                                        ((cmStateSnapshot *)local_360,&this->Snapshot_);
                              bVar1 = cmStateSnapshot::IsValid((cmStateSnapshot *)local_360);
                              if (bVar1) {
                                cmStateSnapshot::GetDirectory
                                          (&local_388,(cmStateSnapshot *)local_360);
                                this_local = (cmStateDirectory *)
                                             GetProperty(&local_388,prop,
                                                         (bool)(parent.Position.Position._7_1_ & 1))
                                ;
                              }
                              else {
                                this_local = (cmStateDirectory *)
                                             cmState::GetGlobalProperty
                                                       ((this->Snapshot_).State,prop);
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return (char *)this_local;
}

Assistant:

const char* cmStateDirectory::GetProperty(const std::string& prop,
                                          bool chain) const
{
  static std::string output;
  output.clear();
  if (prop == "PARENT_DIRECTORY") {
    cmStateSnapshot parent = this->Snapshot_.GetBuildsystemDirectoryParent();
    if (parent.IsValid()) {
      return parent.GetDirectory().GetCurrentSource().c_str();
    }
    return "";
  }
  if (prop == kBINARY_DIR) {
    output = this->GetCurrentBinary();
    return output.c_str();
  }
  if (prop == kSOURCE_DIR) {
    output = this->GetCurrentSource();
    return output.c_str();
  }
  if (prop == kSUBDIRECTORIES) {
    std::vector<std::string> child_dirs;
    std::vector<cmStateSnapshot> const& children =
      this->DirectoryState->Children;
    child_dirs.reserve(children.size());
    for (cmStateSnapshot const& ci : children) {
      child_dirs.push_back(ci.GetDirectory().GetCurrentSource());
    }
    output = cmJoin(child_dirs, ";");
    return output.c_str();
  }
  if (prop == kBUILDSYSTEM_TARGETS) {
    output = cmJoin(this->DirectoryState->NormalTargetNames, ";");
    return output.c_str();
  }

  if (prop == "LISTFILE_STACK") {
    std::vector<std::string> listFiles;
    cmStateSnapshot snp = this->Snapshot_;
    while (snp.IsValid()) {
      listFiles.push_back(snp.GetExecutionListFile());
      snp = snp.GetCallStackParent();
    }
    std::reverse(listFiles.begin(), listFiles.end());
    output = cmJoin(listFiles, ";");
    return output.c_str();
  }
  if (prop == "CACHE_VARIABLES") {
    output = cmJoin(this->Snapshot_.State->GetCacheEntryKeys(), ";");
    return output.c_str();
  }
  if (prop == "VARIABLES") {
    std::vector<std::string> res = this->Snapshot_.ClosureKeys();
    cmAppend(res, this->Snapshot_.State->GetCacheEntryKeys());
    std::sort(res.begin(), res.end());
    output = cmJoin(res, ";");
    return output.c_str();
  }
  if (prop == "INCLUDE_DIRECTORIES") {
    output = cmJoin(this->GetIncludeDirectoriesEntries(), ";");
    return output.c_str();
  }
  if (prop == "COMPILE_OPTIONS") {
    output = cmJoin(this->GetCompileOptionsEntries(), ";");
    return output.c_str();
  }
  if (prop == "COMPILE_DEFINITIONS") {
    output = cmJoin(this->GetCompileDefinitionsEntries(), ";");
    return output.c_str();
  }
  if (prop == "LINK_OPTIONS") {
    output = cmJoin(this->GetLinkOptionsEntries(), ";");
    return output.c_str();
  }
  if (prop == "LINK_DIRECTORIES") {
    output = cmJoin(this->GetLinkDirectoriesEntries(), ";");
    return output.c_str();
  }

  const char* retVal = this->DirectoryState->Properties.GetPropertyValue(prop);
  if (!retVal && chain) {
    cmStateSnapshot parentSnapshot =
      this->Snapshot_.GetBuildsystemDirectoryParent();
    if (parentSnapshot.IsValid()) {
      return parentSnapshot.GetDirectory().GetProperty(prop, chain);
    }
    return this->Snapshot_.State->GetGlobalProperty(prop);
  }

  return retVal;
}